

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_parse_url_path(connectdata *conn)

{
  anon_union_224_10_26c073a1_for_proto *ftpc;
  int *piVar1;
  curl_ftpfile cVar2;
  Curl_easy *data;
  void *pvVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  CURLcode CVar7;
  int iVar8;
  size_t sVar9;
  char **ppcVar10;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  size_t sVar14;
  size_t length;
  char cVar15;
  char *path;
  size_t dlen;
  CURLcode local_54;
  char *local_40;
  size_t local_38;
  
  data = conn->data;
  pvVar3 = (data->req).protop;
  ftpc = &conn->proto;
  pcVar13 = (data->state).path;
  (conn->proto).ftpc.ctl_valid = false;
  (conn->proto).ftpc.cwdfail = false;
  cVar2 = (data->set).ftp_filemethod;
  if (cVar2 == FTPFILE_SINGLECWD) {
    if (*pcVar13 != '\0') {
      pcVar11 = strrchr(pcVar13,0x2f);
      if (pcVar11 == (char *)0x0) goto LAB_0051b155;
      ppcVar10 = (char **)(*Curl_ccalloc)(1,8);
      (conn->proto).ftpc.dirs = ppcVar10;
      if (ppcVar10 == (char **)0x0) {
        local_54 = CURLE_OUT_OF_MEMORY;
LAB_0051b233:
        bVar5 = false;
        pcVar13 = (char *)0x0;
      }
      else {
        length = (long)pcVar11 - (long)pcVar13;
        if (length == 0) {
          length = 1;
        }
        CVar7 = Curl_urldecode(conn->data,pcVar13,length,ppcVar10,(size_t *)0x0,false);
        if (CVar7 != CURLE_OK) {
          freedirs(&ftpc->ftpc);
          local_54 = CVar7;
          goto LAB_0051b233;
        }
        (conn->proto).ftpc.dirdepth = 1;
        pcVar13 = pcVar11 + 1;
        bVar5 = true;
      }
      if (!bVar5) {
        return local_54;
      }
      goto LAB_0051b155;
    }
    (conn->proto).ftpc.dirdepth = 0;
  }
  else {
    if (cVar2 != FTPFILE_NOCWD) {
      *(saslstate *)((long)&conn->proto + 0x80) = SASL_STOP;
      *(uint *)((long)&conn->proto + 0x84) = 5;
      ppcVar10 = (char **)(*Curl_ccalloc)(5,8);
      (conn->proto).ftpc.dirs = ppcVar10;
      if (ppcVar10 == (char **)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      iVar8 = strcmp(pcVar13,"/");
      if (iVar8 == 0) {
        pcVar11 = (*Curl_cstrdup)("/");
        *(conn->proto).ftpc.dirs = pcVar11;
        piVar1 = &(conn->proto).ftpc.dirdepth;
        *piVar1 = *piVar1 + 1;
        pcVar13 = pcVar13 + 1;
      }
      else {
        pcVar11 = strchr(pcVar13,0x2f);
        while (pcVar11 != (char *)0x0) {
          pcVar4 = (data->state).path;
          if (pcVar13 == pcVar4 || (long)pcVar13 - (long)pcVar4 < 0) {
            uVar12 = 0;
          }
          else {
            uVar12 = (ulong)((conn->proto).ftpc.dirdepth == 0);
          }
          if ((long)pcVar11 - (long)pcVar13 == 0) {
            cVar15 = '\x03';
            if ((conn->proto).ftpc.dirdepth == 0) {
              pcVar13 = (*Curl_cstrdup)("/");
              iVar8 = (conn->proto).ftpc.dirdepth;
              (conn->proto).ftpc.dirs[iVar8] = pcVar13;
              (conn->proto).ftpc.dirdepth = iVar8 + 1;
              if ((conn->proto).ftpc.dirs[iVar8] == (char *)0x0) {
                Curl_failf(data,"no memory");
                freedirs(&ftpc->ftpc);
                local_54 = CURLE_OUT_OF_MEMORY;
                cVar15 = '\x01';
              }
            }
LAB_0051b0e9:
            pcVar13 = pcVar11 + 1;
          }
          else {
            CVar7 = Curl_urldecode(conn->data,pcVar13 + -uVar12,
                                   ((long)pcVar11 - (long)pcVar13) + uVar12,
                                   (conn->proto).ftpc.dirs + (conn->proto).ftpc.dirdepth,
                                   (size_t *)0x0,true);
            if (CVar7 != CURLE_OK) {
              freedirs(&ftpc->ftpc);
              local_54 = CVar7;
            }
            cVar15 = '\x01';
            if (CVar7 == CURLE_OK) {
              iVar6 = (conn->proto).ftpc.dirdepth + 1;
              (conn->proto).ftpc.dirdepth = iVar6;
              iVar8 = (conn->proto).ftpc.diralloc;
              cVar15 = '\0';
              if (iVar8 <= iVar6) {
                (conn->proto).ftpc.diralloc = iVar8 * 2;
                ppcVar10 = (char **)(*Curl_crealloc)((conn->proto).ftpc.dirs,(long)iVar8 << 4);
                if (ppcVar10 == (char **)0x0) {
                  freedirs(&ftpc->ftpc);
                  local_54 = CURLE_OUT_OF_MEMORY;
                }
                else {
                  (conn->proto).ftpc.dirs = ppcVar10;
                }
                cVar15 = ppcVar10 == (char **)0x0;
              }
              goto LAB_0051b0e9;
            }
          }
          if ((cVar15 != '\x03') && (cVar15 != '\0')) {
            return local_54;
          }
          pcVar11 = strchr(pcVar13,0x2f);
        }
      }
      goto LAB_0051b155;
    }
    if (*pcVar13 != '\0') {
      sVar9 = strlen(pcVar13);
      if (pcVar13[sVar9 - 1] == '/') {
        pcVar13 = (char *)0x0;
      }
      goto LAB_0051b155;
    }
  }
  pcVar13 = (char *)0x0;
LAB_0051b155:
  if ((pcVar13 == (char *)0x0) || (*pcVar13 == '\0')) {
    (conn->proto).ftpc.file = (char *)0x0;
  }
  else {
    CVar7 = Curl_urldecode(conn->data,pcVar13,0,&(conn->proto).ftpc.file,(size_t *)0x0,true);
    if (CVar7 != CURLE_OK) {
      freedirs(&ftpc->ftpc);
      return CVar7;
    }
  }
  if ((((data->set).upload == true) && ((conn->proto).ftpc.file == (char *)0x0)) &&
     (*(int *)((long)pvVar3 + 0x18) == 0)) {
    Curl_failf(data,"Uploading to a URL without a file name!");
    local_54 = CURLE_URL_MALFORMAT;
  }
  else {
    (conn->proto).ftpc.cwddone = false;
    if ((conn->proto).ftpc.prevpath != (char *)0x0) {
      CVar7 = Curl_urldecode(conn->data,(data->state).path,0,&local_40,&local_38,false);
      if (CVar7 == CURLE_OK) {
        pcVar13 = (conn->proto).ftpc.file;
        if (pcVar13 == (char *)0x0) {
          sVar9 = 0;
        }
        else {
          sVar9 = strlen(pcVar13);
        }
        sVar9 = local_38 - sVar9;
        pcVar13 = (conn->proto).ftpc.prevpath;
        local_38 = sVar9;
        sVar14 = strlen(pcVar13);
        if ((sVar9 == sVar14) && (iVar8 = strncmp(local_40,pcVar13,sVar9), iVar8 == 0)) {
          Curl_infof(data,"Request has same path as previous transfer\n");
          (conn->proto).ftpc.cwddone = true;
        }
        (*Curl_cfree)(local_40);
      }
      else {
        freedirs(&ftpc->ftpc);
        local_54 = CVar7;
      }
      if (CVar7 != CURLE_OK) {
        return local_54;
      }
    }
    local_54 = CURLE_OK;
  }
  return local_54;
}

Assistant:

static
CURLcode ftp_parse_url_path(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  /* the ftp struct is already inited in ftp_connect() */
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  const char *slash_pos;  /* position of the first '/' char in curpos */
  const char *path_to_use = data->state.path;
  const char *cur_pos;
  const char *filename = NULL;

  cur_pos = path_to_use; /* current position in path. point at the begin of
                            next path component */

  ftpc->ctl_valid = FALSE;
  ftpc->cwdfail = FALSE;

  switch(data->set.ftp_filemethod) {
  case FTPFILE_NOCWD:
    /* fastest, but less standard-compliant */

    /*
      The best time to check whether the path is a file or directory is right
      here. so:

      the first condition in the if() right here, is there just in case
      someone decides to set path to NULL one day
   */
    if(path_to_use[0] &&
       (path_to_use[strlen(path_to_use) - 1] != '/') )
      filename = path_to_use;  /* this is a full file path */
    /*
      else {
        ftpc->file is not used anywhere other than for operations on a file.
        In other words, never for directory operations.
        So we can safely leave filename as NULL here and use it as a
        argument in dir/file decisions.
      }
    */
    break;

  case FTPFILE_SINGLECWD:
    /* get the last slash */
    if(!path_to_use[0]) {
      /* no dir, no file */
      ftpc->dirdepth = 0;
      break;
    }
    slash_pos=strrchr(cur_pos, '/');
    if(slash_pos || !*cur_pos) {
      size_t dirlen = slash_pos-cur_pos;
      CURLcode result;

      ftpc->dirs = calloc(1, sizeof(ftpc->dirs[0]));
      if(!ftpc->dirs)
        return CURLE_OUT_OF_MEMORY;

      if(!dirlen)
        dirlen++;

      result = Curl_urldecode(conn->data, slash_pos ? cur_pos : "/",
                              slash_pos ? dirlen : 1,
                              &ftpc->dirs[0], NULL,
                              FALSE);
      if(result) {
        freedirs(ftpc);
        return result;
      }
      ftpc->dirdepth = 1; /* we consider it to be a single dir */
      filename = slash_pos ? slash_pos+1 : cur_pos; /* rest is file name */
    }
    else
      filename = cur_pos;  /* this is a file name only */
    break;

  default: /* allow pretty much anything */
  case FTPFILE_MULTICWD:
    ftpc->dirdepth = 0;
    ftpc->diralloc = 5; /* default dir depth to allocate */
    ftpc->dirs = calloc(ftpc->diralloc, sizeof(ftpc->dirs[0]));
    if(!ftpc->dirs)
      return CURLE_OUT_OF_MEMORY;

    /* we have a special case for listing the root dir only */
    if(!strcmp(path_to_use, "/")) {
      cur_pos++; /* make it point to the zero byte */
      ftpc->dirs[0] = strdup("/");
      ftpc->dirdepth++;
    }
    else {
      /* parse the URL path into separate path components */
      while((slash_pos = strchr(cur_pos, '/')) != NULL) {
        /* 1 or 0 pointer offset to indicate absolute directory */
        ssize_t absolute_dir = ((cur_pos - data->state.path > 0) &&
                                (ftpc->dirdepth == 0))?1:0;

        /* seek out the next path component */
        if(slash_pos-cur_pos) {
          /* we skip empty path components, like "x//y" since the FTP command
             CWD requires a parameter and a non-existent parameter a) doesn't
             work on many servers and b) has no effect on the others. */
          size_t len = slash_pos - cur_pos + absolute_dir;
          CURLcode result =
            Curl_urldecode(conn->data, cur_pos - absolute_dir, len,
                           &ftpc->dirs[ftpc->dirdepth], NULL,
                           TRUE);
          if(result) {
            freedirs(ftpc);
            return result;
          }
        }
        else {
          cur_pos = slash_pos + 1; /* jump to the rest of the string */
          if(!ftpc->dirdepth) {
            /* path starts with a slash, add that as a directory */
            ftpc->dirs[ftpc->dirdepth] = strdup("/");
            if(!ftpc->dirs[ftpc->dirdepth++]) { /* run out of memory ... */
              failf(data, "no memory");
              freedirs(ftpc);
              return CURLE_OUT_OF_MEMORY;
            }
          }
          continue;
        }

        cur_pos = slash_pos + 1; /* jump to the rest of the string */
        if(++ftpc->dirdepth >= ftpc->diralloc) {
          /* enlarge array */
          char **bigger;
          ftpc->diralloc *= 2; /* double the size each time */
          bigger = realloc(ftpc->dirs, ftpc->diralloc * sizeof(ftpc->dirs[0]));
          if(!bigger) {
            freedirs(ftpc);
            return CURLE_OUT_OF_MEMORY;
          }
          ftpc->dirs = bigger;
        }
      }
    }
    filename = cur_pos;  /* the rest is the file name */
    break;
  } /* switch */

  if(filename && *filename) {
    CURLcode result =
      Curl_urldecode(conn->data, filename, 0,  &ftpc->file, NULL, TRUE);

    if(result) {
      freedirs(ftpc);
      return result;
    }
  }
  else
    ftpc->file=NULL; /* instead of point to a zero byte, we make it a NULL
                       pointer */

  if(data->set.upload && !ftpc->file && (ftp->transfer == FTPTRANSFER_BODY)) {
    /* We need a file name when uploading. Return error! */
    failf(data, "Uploading to a URL without a file name!");
    return CURLE_URL_MALFORMAT;
  }

  ftpc->cwddone = FALSE; /* default to not done */

  if(ftpc->prevpath) {
    /* prevpath is "raw" so we convert the input path before we compare the
       strings */
    size_t dlen;
    char *path;
    CURLcode result =
      Curl_urldecode(conn->data, data->state.path, 0, &path, &dlen, FALSE);
    if(result) {
      freedirs(ftpc);
      return result;
    }

    dlen -= ftpc->file?strlen(ftpc->file):0;
    if((dlen == strlen(ftpc->prevpath)) &&
       !strncmp(path, ftpc->prevpath, dlen)) {
      infof(data, "Request has same path as previous transfer\n");
      ftpc->cwddone = TRUE;
    }
    free(path);
  }

  return CURLE_OK;
}